

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MruDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::TryGetValue(MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
              *this,RegexKey *key,RegexPattern **value)

{
  bool bVar1;
  MruListEntry *element;
  RegexPattern **ppRVar2;
  RegexKey *key_00;
  MruListEntry *entry;
  MruDictionaryData *pMStack_30;
  int dictionaryDataIndex;
  MruDictionaryData *dictionaryData;
  RegexPattern **value_local;
  RegexKey *key_local;
  MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  *this_local;
  
  dictionaryData = (MruDictionaryData *)value;
  value_local = (RegexPattern **)key;
  key_local = (RegexKey *)this;
  bVar1 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<UnifiedRegex::RegexKey>
                    (&this->dictionary,key,&stack0xffffffffffffffd0,(int *)((long)&entry + 4));
  if (bVar1) {
    element = MruDictionaryData::Entry(pMStack_30);
    if (element == (MruListEntry *)0x0) {
      ppRVar2 = MruDictionaryData::Value(pMStack_30);
      (dictionaryData->entry).ptr = (MruListEntry *)*ppRVar2;
      key_00 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetKeyAt(&this->dictionary,entry._4_4_);
      ppRVar2 = MruDictionaryData::Value(pMStack_30);
      ReuseLeastRecentlyUsedEntry(this,key_00,ppRVar2,entry._4_4_);
      this_local._7_1_ = true;
    }
    else {
      DoublyLinkedList<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
      ::MoveToBeginning(&this->entries,element);
      ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RegexPattern__
                          ((WriteBarrierPtr *)&element->value);
      (dictionaryData->entry).ptr = (MruListEntry *)*ppRVar2;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TryGetValue(const TKey &key, TValue *const value)
        {
            MruDictionaryData *dictionaryData;
            int dictionaryDataIndex;
            if(!dictionary.TryGetReference(key, &dictionaryData, &dictionaryDataIndex))
                return false;

            const auto entry = dictionaryData->Entry();
            if(entry)
            {
                // Make this the most recently used entry
                entries.MoveToBeginning(entry);
                *value = entry->value;
                return true;
            }

            *value = dictionaryData->Value();

            // The key passed into this function may be temporary, and should not be placed in the MRU list or dictionary. Get
            // the proper key to be used from the dictionary. That key should have the necessary lifetime.
            ReuseLeastRecentlyUsedEntry(dictionary.GetKeyAt(dictionaryDataIndex), dictionaryData->Value(), dictionaryDataIndex);

            return true;
        }